

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void Catch::defaultListReporters
               (ostream *out,
               vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
               *descriptions,Verbosity verbosity)

{
  Columns *__return_storage_ptr__;
  pointer pRVar1;
  size_type sVar2;
  pointer pRVar3;
  pointer pRVar4;
  pointer pRVar5;
  pointer pRVar6;
  size_t sVar7;
  Column *this;
  pointer text;
  Column local_e8;
  undefined1 local_a8 [56];
  Column local_70;
  
  std::operator<<(out,"Available reporters:\n");
  text = (descriptions->
         super__Vector_base<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
         )._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (descriptions->
           super__Vector_base<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pRVar6 = text;
  pRVar5 = text;
  pRVar3 = text;
  if (text != pRVar1) {
    while (pRVar5 = pRVar6, pRVar6 = pRVar3 + 1, pRVar6 != pRVar1) {
      pRVar4 = pRVar3 + 1;
      pRVar3 = pRVar6;
      if ((pRVar4->name)._M_string_length <= (pRVar5->name)._M_string_length) {
        pRVar6 = pRVar5;
      }
    }
  }
  sVar2 = (pRVar5->name)._M_string_length;
  sVar7 = sVar2 + 5;
  __return_storage_ptr__ = (Columns *)(local_a8 + 0x20);
  for (; text != pRVar1; text = text + 1) {
    if (verbosity == Quiet) {
      TextFlow::Column::Column(&local_e8,&text->name);
      local_e8.m_indent = 2;
      local_e8.m_width = sVar7;
      TextFlow::operator<<(out,&local_e8);
      std::operator<<(out,'\n');
      this = &local_e8;
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                     &text->name,':');
      TextFlow::Column::Column
                (&local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
      local_e8.m_indent = 2;
      local_e8.m_width = sVar7;
      TextFlow::Column::Column(&local_70,&text->description);
      local_70.m_initialIndent = 0;
      local_70.m_indent = 2;
      local_70.m_width = 0x48 - sVar2;
      TextFlow::operator+(__return_storage_ptr__,&local_e8,&local_70);
      TextFlow::operator<<(out,__return_storage_ptr__);
      std::operator<<(out,'\n');
      std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::~vector
                ((vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_> *)
                 __return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_e8);
      this = (Column *)local_a8;
    }
    std::__cxx11::string::~string((string *)this);
  }
  std::operator<<(out,'\n');
  std::ostream::flush();
  return;
}

Assistant:

void
    defaultListReporters( std::ostream& out,
                          std::vector<ReporterDescription> const& descriptions,
                          Verbosity verbosity ) {
        out << "Available reporters:\n";
        const auto maxNameLen =
            std::max_element( descriptions.begin(),
                              descriptions.end(),
                              []( ReporterDescription const& lhs,
                                  ReporterDescription const& rhs ) {
                                  return lhs.name.size() < rhs.name.size();
                              } )
                ->name.size();

        for ( auto const& desc : descriptions ) {
            if ( verbosity == Verbosity::Quiet ) {
                out << TextFlow::Column( desc.name )
                           .indent( 2 )
                           .width( 5 + maxNameLen )
                    << '\n';
            } else {
                out << TextFlow::Column( desc.name + ':' )
                               .indent( 2 )
                               .width( 5 + maxNameLen ) +
                           TextFlow::Column( desc.description )
                               .initialIndent( 0 )
                               .indent( 2 )
                               .width( CATCH_CONFIG_CONSOLE_WIDTH - maxNameLen - 8 )
                    << '\n';
            }
        }
        out << '\n' << std::flush;
    }